

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
file<std::basic_ofstream<char,_std::char_traits<char>_>_>::~file
          (file<std::basic_ofstream<char,_std::char_traits<char>_>_> *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_basic_ofstream<char,_std::char_traits<char>_>).
  super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x121a38;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x118 = 0x121a60
  ;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  puVar1 = *(undefined1 **)
            &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
             super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  puVar2 = &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
            super_basic_ostream<char,_std::char_traits<char>_>.field_0x108;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  std::ios_base::~ios_base
            ((ios_base *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x118);
  return;
}

Assistant:

file(const std::string& name)  // non explicit
      : std::string{name}, TFStream{name} {}